

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
despot::Floor::ComputeShortestPath
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Floor *this,int start,int end)

{
  double *pdVar1;
  int iVar2;
  iterator __position;
  double dVar3;
  uint uVar4;
  Coord CVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int a;
  long lVar9;
  undefined1 *second;
  int move;
  int local_50;
  int local_4c;
  vector<int,std::allocator<int>> *local_48;
  double local_40;
  Coord local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (start != end) {
    local_4c = end;
    local_48 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
    do {
      local_50 = 0;
      lVar8 = (long)start;
      local_40 = *(double *)
                  (*(long *)&(this->dist_).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar8].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data + (long)end * 8);
      dVar3 = (double)(int)((ulong)((long)(this->cells_).
                                          super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->cells_).
                                         super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((local_40 == dVar3) && (!NAN(local_40) && !NAN(dVar3))) {
        return __return_storage_ptr__;
      }
      second = Compass::DIRECTIONS;
      lVar9 = 0;
      do {
        local_38 = (this->cells_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar8];
        CVar5 = operator+(&local_38,(Coord *)second);
        __return_storage_ptr__ = (vector<int,_std::allocator<int>_> *)local_48;
        uVar4 = CVar5.x;
        lVar7 = lVar8;
        iVar6 = start;
        if ((((-1 < (int)uVar4) && (-1 < (long)CVar5)) && ((int)uVar4 < this->num_cols_)) &&
           (CVar5.y < this->num_rows_)) {
          iVar2 = this->floor_[(ulong)CVar5 >> 0x20][uVar4 & 0x7fffffff];
          if (iVar2 != INVALID) {
            lVar7 = (long)iVar2;
            iVar6 = iVar2;
          }
        }
        pdVar1 = (double *)
                 (*(long *)&(this->dist_).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar7].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + (long)end * 8);
        if (*pdVar1 <= local_40 && local_40 != *pdVar1) {
          local_50 = (int)lVar9;
          start = iVar6;
          break;
        }
        lVar9 = lVar9 + 1;
        second = (undefined1 *)((long)second + 8);
      } while (lVar9 != 4);
      __position._M_current = *(int **)(local_48 + 8);
      if (__position._M_current == *(int **)(local_48 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_48,__position,&local_50);
      }
      else {
        *__position._M_current = local_50;
        *(int **)(local_48 + 8) = __position._M_current + 1;
      }
    } while (start != local_4c);
  }
  return (vector<int,_std::allocator<int>_> *)
         (vector<int,std::allocator<int>> *)__return_storage_ptr__;
}

Assistant:

vector<int> Floor::ComputeShortestPath(int start, int end) const {
	int cur = start;
	vector<int> moves;
	while (cur != end) {
		int move = 0;
		double cur_dist = Distance(cur, end);

		if (cur_dist == NumCells()) {
			return moves;
		}

		for (int a = 0; a < 4; a++) {
			Coord pos = GetCell(cur) + Compass::DIRECTIONS[a];
			int next = cur;
			if (Inside(pos))
				next = GetIndex(pos);

			double dist = Distance(next, end);

			if (dist < cur_dist) {
				move = a;
				cur = next;
				break;
			}
		}
		moves.push_back(move);
	}
	return moves;
}